

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArraySamplingTest::programDefinition::programDefinition
          (programDefinition *this)

{
  this->m_gl = (Functions *)0x0;
  this->compute_shader = (shaderDefinition *)0x0;
  this->geometry_shader = (shaderDefinition *)0x0;
  this->fragment_shader = (shaderDefinition *)0x0;
  this->tesselation_control_shader = (shaderDefinition *)0x0;
  this->tesselation_evaluation_shader = (shaderDefinition *)0x0;
  this->vertex_shader = (shaderDefinition *)0x0;
  this->m_program_object_id = 0;
  return;
}

Assistant:

TextureCubeMapArraySamplingTest::programDefinition::programDefinition()
	: compute_shader(0)
	, geometry_shader(0)
	, fragment_shader(0)
	, tesselation_control_shader(0)
	, tesselation_evaluation_shader(0)
	, vertex_shader(0)
	, m_program_object_id(m_invalid_program_object_id)
	, m_gl(DE_NULL)
{
}